

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O2

ParseStatus ParseVP8X(WebPDemuxer *dmux)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  int iVar5;
  ParseStatus PVar6;
  size_t sVar7;
  Frame *frame;
  Chunk *pCVar8;
  ParseStatus PVar9;
  size_t sVar10;
  int iVar11;
  ParseStatus PVar12;
  uint uVar13;
  size_t sVar14;
  uint uVar15;
  ParseStatus PVar17;
  size_t sVar18;
  ulong uVar16;
  
  sVar18 = (dmux->mem_).start_;
  sVar14 = (dmux->mem_).end_;
  PVar12 = PARSE_NEED_MORE_DATA;
  PVar6 = PVar12;
  if (7 < sVar14 - sVar18) {
    dmux->is_ext_format_ = 1;
    (dmux->mem_).start_ = sVar18 + 4;
    puVar4 = (dmux->mem_).buf_;
    uVar13 = *(uint *)(puVar4 + sVar18 + 4);
    sVar7 = sVar18 + 8;
    (dmux->mem_).start_ = sVar7;
    PVar17 = PARSE_ERROR;
    PVar6 = PVar17;
    if (0x12 < uVar13 + 9) {
      uVar13 = (uVar13 & 1) + uVar13;
      if (((ulong)uVar13 <= (dmux->mem_).riff_end_ - sVar7) &&
         (PVar6 = PVar12, (ulong)uVar13 <= sVar14 - sVar7)) {
        dmux->feature_flags_ = (uint)puVar4[sVar18 + 8];
        (dmux->mem_).start_ = sVar18 + 0xc;
        iVar5 = ReadLE24s(&dmux->mem_);
        dmux->canvas_width_ = iVar5 + 1;
        iVar5 = ReadLE24s(&dmux->mem_);
        dmux->canvas_height_ = iVar5 + 1U;
        PVar6 = PVar17;
        if ((ulong)(iVar5 + 1U) * (long)dmux->canvas_width_ >> 0x20 == 0) {
          sVar14 = (ulong)(uVar13 - 10) + (dmux->mem_).start_;
          (dmux->mem_).start_ = sVar14;
          dmux->state_ = WEBP_DEMUX_PARSED_HEADER;
          sVar18 = (dmux->mem_).riff_end_;
          if ((7 < sVar18 - sVar14) &&
             (sVar7 = (dmux->mem_).end_, PVar6 = PVar12, 7 < sVar7 - sVar14)) {
            uVar13 = dmux->feature_flags_;
            PVar17 = PARSE_OK;
            PVar12 = PARSE_NEED_MORE_DATA;
            do {
              puVar4 = (dmux->mem_).buf_;
              iVar5 = *(int *)(puVar4 + sVar14);
              (dmux->mem_).start_ = sVar14 + 4;
              uVar2 = *(uint *)(puVar4 + sVar14 + 4);
              sVar10 = sVar14 + 8;
              (dmux->mem_).start_ = sVar10;
              if (0xfffffff6 < (ulong)uVar2) {
                return PARSE_ERROR;
              }
              uVar15 = (uVar2 & 1) + uVar2;
              uVar16 = (ulong)uVar15;
              if (sVar18 - sVar10 < uVar16) {
                return PARSE_ERROR;
              }
              PVar6 = PVar12;
              if (iVar5 == 0x20385056) {
LAB_00105f7a:
                if (PVar17 != PARSE_OK) {
                  return PARSE_ERROR;
                }
                if ((uVar13 & 2) != 0) {
                  return PARSE_ERROR;
                }
                (dmux->mem_).start_ = sVar14;
                PVar6 = ParseSingleImage(dmux);
                PVar17 = PARSE_OK;
                goto LAB_00106148;
              }
              if (iVar5 == 0x20504d58) {
                iVar11 = 2;
LAB_001060ef:
                if (uVar16 <= sVar7 - sVar10) {
                  if ((dmux->feature_flags_ >> iVar11 & 1) != 0) {
LAB_00106104:
                    pCVar8 = (Chunk *)WebPSafeCalloc(1,0x18);
                    if (pCVar8 == (Chunk *)0x0) {
                      return PARSE_ERROR;
                    }
                    (pCVar8->data_).offset_ = sVar14;
                    (pCVar8->data_).size_ = (ulong)uVar2 + 8;
                    *dmux->chunks_tail_ = pCVar8;
                    pCVar8->next_ = (Chunk *)0x0;
                    dmux->chunks_tail_ = &pCVar8->next_;
                    sVar10 = (dmux->mem_).start_;
                  }
LAB_00106140:
                  (dmux->mem_).start_ = sVar10 + uVar16;
                  PVar6 = PARSE_OK;
                }
              }
              else {
                if (iVar5 == 0x46495845) {
                  iVar11 = 3;
                  goto LAB_001060ef;
                }
                if (iVar5 == 0x464d4e41) {
                  if (PVar17 == PARSE_OK) {
                    return PARSE_ERROR;
                  }
                  PVar17 = PVar12;
                  PVar6 = PARSE_ERROR;
                  if ((0xf < uVar15) && (PVar6 = PVar12, 0xf < sVar7 - sVar10)) {
                    uVar2 = dmux->feature_flags_;
                    frame = (Frame *)WebPSafeCalloc(1,0x50);
                    PVar6 = PARSE_ERROR;
                    if (frame != (Frame *)0x0) {
                      iVar5 = ReadLE24s(&dmux->mem_);
                      frame->x_offset_ = iVar5 * 2;
                      iVar5 = ReadLE24s(&dmux->mem_);
                      frame->y_offset_ = iVar5 * 2;
                      iVar5 = ReadLE24s(&dmux->mem_);
                      frame->width_ = iVar5 + 1;
                      iVar5 = ReadLE24s(&dmux->mem_);
                      frame->height_ = iVar5 + 1;
                      iVar5 = ReadLE24s(&dmux->mem_);
                      frame->duration_ = iVar5;
                      sVar18 = (dmux->mem_).start_;
                      bVar1 = (dmux->mem_).buf_[sVar18];
                      sVar18 = sVar18 + 1;
                      (dmux->mem_).start_ = sVar18;
                      frame->dispose_method_ = bVar1 & WEBP_MUX_DISPOSE_BACKGROUND;
                      frame->blend_method_ = bVar1 >> 1 & WEBP_MUX_NO_BLEND;
                      if ((ulong)((long)frame->height_ * (long)frame->width_) >> 0x20 == 0) {
                        PVar6 = StoreFrame(dmux->num_frames_ + 1,uVar15 - 0x10,&dmux->mem_,frame);
                        PVar9 = PARSE_ERROR;
                        if (PVar6 != PARSE_ERROR) {
                          PVar9 = PVar6;
                          if ((ulong)(uVar15 - 0x10) < (dmux->mem_).start_ - sVar18) {
                            PVar9 = PARSE_ERROR;
                          }
                          if (((PVar9 != PARSE_ERROR) && ((uVar2 & 2) != 0)) &&
                             (PVar9 = PVar6, 0 < frame->frame_num_)) {
                            iVar5 = AddFrame(dmux,frame);
                            PVar9 = PARSE_ERROR;
                            if (iVar5 != 0) {
                              dmux->num_frames_ = dmux->num_frames_ + 1;
                              goto LAB_00106148;
                            }
                          }
                        }
                        WebPSafeFree(frame);
                        PVar6 = PVar9;
                      }
                      else {
                        WebPSafeFree(frame);
                        PVar6 = PARSE_ERROR;
                      }
                    }
                  }
                  goto LAB_00106148;
                }
                if ((iVar5 == 0x48504c41) || (iVar5 == 0x4c385056)) goto LAB_00105f7a;
                if (iVar5 != 0x4d494e41) {
                  iVar11 = 5;
                  if (iVar5 == 0x50434349) goto LAB_001060ef;
                  if (iVar5 == 0x58385056) {
                    return PARSE_ERROR;
                  }
                  if (sVar7 - sVar10 < uVar16) goto LAB_00106148;
                  goto LAB_00106104;
                }
                if (uVar15 < 6) {
                  return PARSE_ERROR;
                }
                if (uVar16 <= sVar7 - sVar10) {
                  if (PVar17 == PARSE_OK) {
                    uVar3 = *(uint32_t *)(puVar4 + sVar14 + 8);
                    (dmux->mem_).start_ = sVar14 + 0xc;
                    dmux->bgcolor_ = uVar3;
                    dmux->loop_count_ = (uint)*(ushort *)(puVar4 + sVar14 + 0xc);
                    (dmux->mem_).start_ = sVar14 + (uVar15 - 6) + 0xe;
                    PVar17 = PVar12;
                    PVar6 = PARSE_OK;
                    goto LAB_00106148;
                  }
                  goto LAB_00106140;
                }
              }
LAB_00106148:
              sVar14 = (dmux->mem_).start_;
              sVar18 = (dmux->mem_).riff_end_;
              if (sVar14 == sVar18) {
                return PVar6;
              }
              sVar7 = (dmux->mem_).end_;
              if (sVar7 - sVar14 < 8) {
                PVar6 = PVar12;
              }
            } while (PVar6 == PARSE_OK);
          }
        }
      }
    }
  }
  return PVar6;
}

Assistant:

static ParseStatus ParseVP8X(WebPDemuxer* const dmux) {
  MemBuffer* const mem = &dmux->mem_;
  uint32_t vp8x_size;

  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  dmux->is_ext_format_ = 1;
  Skip(mem, TAG_SIZE);  // VP8X
  vp8x_size = ReadLE32(mem);
  if (vp8x_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;
  if (vp8x_size < VP8X_CHUNK_SIZE) return PARSE_ERROR;
  vp8x_size += vp8x_size & 1;
  if (SizeIsInvalid(mem, vp8x_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < vp8x_size) return PARSE_NEED_MORE_DATA;

  dmux->feature_flags_ = ReadByte(mem);
  Skip(mem, 3);  // Reserved.
  dmux->canvas_width_  = 1 + ReadLE24s(mem);
  dmux->canvas_height_ = 1 + ReadLE24s(mem);
  if (dmux->canvas_width_ * (uint64_t)dmux->canvas_height_ >= MAX_IMAGE_AREA) {
    return PARSE_ERROR;  // image final dimension is too large
  }
  Skip(mem, vp8x_size - VP8X_CHUNK_SIZE);  // skip any trailing data.
  dmux->state_ = WEBP_DEMUX_PARSED_HEADER;

  if (SizeIsInvalid(mem, CHUNK_HEADER_SIZE)) return PARSE_ERROR;
  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  return ParseVP8XChunks(dmux);
}